

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

CURLcode Curl_add_handle_to_pipeline(Curl_easy *handle,connectdata *conn)

{
  curl_llist *list;
  curl_llist_element *pcVar1;
  curl_llist_element *pcVar2;
  int iVar3;
  CURLcode CVar4;
  
  list = conn->send_pipe;
  pcVar1 = list->head;
  iVar3 = Curl_llist_insert_next(list,list->tail,handle);
  if ((list == conn->send_pipe) && (pcVar2 = conn->send_pipe->head, pcVar1 != pcVar2)) {
    conn->writechannel_inuse = false;
    Curl_expire((Curl_easy *)pcVar2->ptr,0);
  }
  CVar4 = CURLE_OUT_OF_MEMORY;
  if (iVar3 != 0) {
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_add_handle_to_pipeline(struct Curl_easy *handle,
                                     struct connectdata *conn)
{
  struct curl_llist_element *sendhead = conn->send_pipe->head;
  struct curl_llist *pipeline;
  CURLcode result;

  pipeline = conn->send_pipe;

  result = addHandleToPipeline(handle, pipeline);

  if(pipeline == conn->send_pipe && sendhead != conn->send_pipe->head) {
    /* this is a new one as head, expire it */
    Curl_pipeline_leave_write(conn); /* not in use yet */
    Curl_expire(conn->send_pipe->head->ptr, 0);
  }

#if 0 /* enable for pipeline debugging */
  print_pipeline(conn);
#endif

  return result;
}